

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall GraphTestCycleInEdgesButNotInNodes3::Run(GraphTestCycleInEdgesButNotInNodes3 *this)

{
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  Node *node;
  string err;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  iVar1 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "build a b: cat c\nbuild c: cat a\n",(ManifestParserOptions)0x0);
  pTVar2 = g_current_test;
  iVar4 = g_current_test->assertion_failures_;
  if (iVar1 == iVar4) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"b",&local_61);
    node = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_40);
    bVar3 = DependencyScan::RecomputeDirty(&(this->super_GraphTest).scan_,node,&local_60);
    testing::Test::Check
              (pTVar2,!bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x175,"scan_.RecomputeDirty(GetNode(\"b\"), &err)");
    std::__cxx11::string::~string((string *)&local_40);
    pTVar2 = g_current_test;
    bVar3 = std::operator==("dependency cycle: a -> c -> a",&local_60);
    bVar3 = testing::Test::Check
                      (pTVar2,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                       ,0x176,"\"dependency cycle: a -> c -> a\" == err");
    if (bVar3) goto LAB_00151553;
    iVar4 = g_current_test->assertion_failures_;
  }
  g_current_test->assertion_failures_ = iVar4 + 1;
LAB_00151553:
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

TEST_F(GraphTest, CycleInEdgesButNotInNodes3) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build a b: cat c\n"
"build c: cat a\n"));
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("b"), &err));
  ASSERT_EQ("dependency cycle: a -> c -> a", err);
}